

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

void __thiscall cmDocumentation::addCommonStandardDocSections(cmDocumentation *this)

{
  cmDocumentationSection *this_00;
  mapped_type *ppcVar1;
  key_type local_38;
  
  this_00 = (cmDocumentationSection *)operator_new(0x38);
  (this_00->Name)._M_dataplus._M_p = (pointer)&(this_00->Name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"Options","");
  (this_00->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->Entries).super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmDocumentationSection::Append(this_00,cmDocumentationStandardOptions);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Options","");
  ppcVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
            ::operator[](&this->AllSections,&local_38);
  *ppcVar1 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmDocumentation::addCommonStandardDocSections()
{
    cmDocumentationSection *sec;

    sec = new cmDocumentationSection("Options","OPTIONS");
    sec->Append(cmDocumentationStandardOptions);
    this->AllSections["Options"] = sec;
}